

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair_hash.hpp
# Opt level: O3

int __thiscall
pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::init
          (pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  uint in_ECX;
  undefined8 in_RDX;
  allocator_type local_82;
  allocator_type local_81;
  vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_> local_80;
  undefined1 local_68 [16];
  pointer local_58;
  value_type local_48;
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  local_38;
  
  (this->null).F_ab = in_ECX;
  (this->null).P_ab = (int)in_RDX;
  (this->null).L_ab = (int)((ulong)in_RDX >> 0x20);
  std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>::vector
            (&local_80,(ulong)ctx & 0xffffffff,&local_48,&local_81);
  std::
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ::vector((vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
            *)local_68,(ulong)ctx & 0xffffffff,&local_80,&local_82);
  local_38.
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->H).
       super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->H).
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
  local_38.
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->H).
       super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->H).
       super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->H).
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
  (this->H).
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
  local_68 = ZEXT816(0) << 0x20;
  local_58 = (pointer)0x0;
  std::
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ::~vector(&local_38);
  std::
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
             *)local_68);
  iVar1 = extraout_EAX;
  if (local_80.super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void init(itype max_alphabet_size, el_type null_el){

		this->null = null_el;

		H = vector<vector<el_type> >(max_alphabet_size,vector<el_type>(max_alphabet_size,null_el));

	}